

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O3

type jsoncons::jsonpointer::
     get<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,char[7]>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
               char (*location_str) [7],bool create_if_missing,error_code *ec)

{
  basic_json_pointer<char> jsonptr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_48;
  string_view_type local_30;
  
  local_30._M_len = strlen(*location_str);
  local_30._M_str = *location_str;
  basic_json_pointer<char>::parse((basic_json_pointer<char> *)&vStack_48,&local_30,ec);
  if (ec->_M_value == 0) {
    root = get<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                     (root,(basic_json_pointer<char> *)&vStack_48,create_if_missing,ec);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_48);
  return root;
}

Assistant:

typename std::enable_if<std::is_convertible<StringSource,jsoncons::basic_string_view<typename Json::char_type>>::value,Json&>::type
    get(Json& root, 
        const StringSource& location_str, 
        bool create_if_missing,
        std::error_code& ec)
    {
        auto jsonptr = basic_json_pointer<typename Json::char_type>::parse(location_str, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return root;
        }
        return get(root, jsonptr, create_if_missing, ec);
    }